

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

string * __thiscall
CLI::detail::
generate_set<std::map<int,double,std::less<int>,std::allocator<std::pair<int_const,double>>>>
          (string *__return_storage_ptr__,detail *this,
          map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *set)

{
  detail *pdVar1;
  allocator local_79;
  string local_78 [40];
  string local_50 [54];
  allocator local_1a;
  undefined1 local_19;
  detail *local_18;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *set_local;
  string *out;
  
  local_19 = 0;
  local_18 = this;
  set_local = (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
              __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,1,'{',&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  pdVar1 = (detail *)
           smart_deref<const_std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>,_(CLI::detail::enabler)0>
                     ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                       *)local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,",",&local_79);
  join<std::map<int,double,std::less<int>,std::allocator<std::pair<int_const,double>>>,CLI::detail::generate_set<std::map<int,double,std::less<int>,std::allocator<std::pair<int_const,double>>>>(std::map<int,double,std::less<int>,std::allocator<std::pair<int_const,double>>>const&)::_lambda(std::pair<int_const,double>const&)_1_,void>
            (local_50,pdVar1,local_78);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string generate_set(const T &set) {
    using element_t = typename detail::element_type<T>::type;
    using iteration_type_t = typename detail::pair_adaptor<element_t>::value_type;  // the type of the object pair
    std::string out(1, '{');
    out.append(detail::join(
        detail::smart_deref(set),
        [](const iteration_type_t &v) { return detail::pair_adaptor<element_t>::first(v); },
        ","));
    out.push_back('}');
    return out;
}